

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O3

size_t DObject::StaticPointerSubstitution(DObject *old,DObject *notOld,bool scandefaults)

{
  PClassActor **ppPVar1;
  FSectorPortal *pFVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  DObject *pDVar6;
  sector_t_conflict *psVar7;
  long lVar8;
  player_t *this;
  long *plVar9;
  long lVar10;
  int iVar12;
  size_t sVar11;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  lVar8 = 0;
  for (plVar9 = GC::Root; ppPVar1 = PClassActor::AllActorClasses.Array, plVar9 != (long *)0x0;
      plVar9 = (long *)plVar9[2]) {
    lVar3 = (**(code **)(*plVar9 + 0x28))(plVar9,old,notOld);
    lVar8 = lVar8 + lVar3;
  }
  if ((scandefaults) && (uVar5 = (ulong)PClassActor::AllActorClasses.Count, uVar5 != 0)) {
    lVar3 = 0;
    do {
      pDVar6 = (DObject *)(*(PClass **)((long)ppPVar1 + lVar3))->Defaults;
      if (pDVar6 != (DObject *)0x0) {
        pDVar6->Class = *(PClass **)((long)ppPVar1 + lVar3);
        PointerSubstitution(pDVar6,old,notOld);
        pDVar6->Class = (PClass *)0x0;
      }
      lVar3 = lVar3 + 8;
    } while (uVar5 << 3 != lVar3);
  }
  lVar10 = 0;
  iVar12 = (int)((ulong)old >> 0x20);
  lVar3 = 0;
  do {
    auVar14._0_4_ = -(uint)(*(int *)(bodyque + lVar3) == (int)old);
    auVar14._4_4_ = -(uint)(*(int *)((long)bodyque + lVar3 * 8 + 4) == iVar12);
    auVar14._8_4_ = -(uint)(*(int *)(bodyque + lVar3 + 1) == (int)old);
    auVar14._12_4_ = -(uint)(*(int *)((long)bodyque + lVar3 * 8 + 0xc) == iVar12);
    auVar13._4_4_ = auVar14._0_4_;
    auVar13._0_4_ = auVar14._4_4_;
    auVar13._8_4_ = auVar14._12_4_;
    auVar13._12_4_ = auVar14._8_4_;
    auVar13 = auVar13 & auVar14;
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      bodyque[lVar3] = (AActor *)notOld;
    }
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      bodyque[lVar3 + 1] = (AActor *)notOld;
    }
    lVar8 = lVar8 - auVar13._0_8_;
    lVar10 = lVar10 - auVar13._8_8_;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x20);
  sVar11 = lVar10 + lVar8;
  this = (player_t *)&players;
  lVar8 = 0;
  do {
    if (playeringame[lVar8] == true) {
      sVar4 = player_t::FixPointers(this,old,notOld);
      sVar11 = sVar11 + sVar4;
    }
    pFVar2 = sectorPortals.Array;
    lVar8 = lVar8 + 1;
    this = this + 1;
  } while (lVar8 != 8);
  uVar5 = (ulong)sectorPortals.Count;
  if (uVar5 != 0) {
    lVar8 = 0;
    do {
      pDVar6 = *(DObject **)((long)&(pFVar2->mSkybox).field_0 + lVar8);
      if (pDVar6 == (DObject *)0x0) {
LAB_003781f9:
        pDVar6 = (DObject *)0x0;
      }
      else if ((pDVar6->ObjectFlags & 0x20) != 0) {
        *(undefined8 *)((long)&(pFVar2->mSkybox).field_0 + lVar8) = 0;
        goto LAB_003781f9;
      }
      if (pDVar6 == old) {
        *(DObject **)((long)&(pFVar2->mSkybox).field_0 + lVar8) = notOld;
        sVar11 = sVar11 + 1;
      }
      lVar8 = lVar8 + 0x40;
    } while (uVar5 << 6 != lVar8);
  }
  if ((sectors != (sector_t_conflict *)0x0) && (0 < numsectors)) {
    lVar8 = 0;
    lVar3 = 0;
    psVar7 = sectors;
    do {
      if (*(DObject **)((long)psVar7->terrainnum + lVar8 + -0x48) == old) {
        *(DObject **)((long)psVar7->terrainnum + lVar8 + -0x48) = notOld;
        sVar11 = sVar11 + 1;
        psVar7 = sectors;
      }
      if (*(DObject **)((long)psVar7->Portals + lVar8 + -8) == old) {
        *(DObject **)((long)psVar7->Portals + lVar8 + -8) = notOld;
        sVar11 = sVar11 + 1;
        psVar7 = sectors;
      }
      if (*(DObject **)((long)psVar7->terrainnum + lVar8 + 8) == old) {
        *(DObject **)((long)psVar7->terrainnum + lVar8 + 8) = notOld;
        sVar11 = sVar11 + 1;
        psVar7 = sectors;
      }
      if (*(DObject **)((long)psVar7->terrainnum + lVar8 + 0x10) == old) {
        *(DObject **)((long)psVar7->terrainnum + lVar8 + 0x10) = notOld;
        sVar11 = sVar11 + 1;
        psVar7 = sectors;
      }
      if (*(DObject **)
           ((long)&((TObjPtr<DSectorEffect> *)(psVar7->interpolations + -1))->field_0 + lVar8) ==
          old) {
        *(DObject **)
         ((long)&((TObjPtr<DSectorEffect> *)(psVar7->interpolations + -1))->field_0 + lVar8) =
             notOld;
        sVar11 = sVar11 + 1;
        psVar7 = sectors;
      }
      lVar3 = lVar3 + 1;
      lVar8 = lVar8 + 0x218;
    } while (lVar3 < numsectors);
  }
  if (bglobal.firstthing.field_0 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)old) {
    sVar11 = sVar11 + 1;
    bglobal.firstthing.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)notOld;
  }
  if (bglobal.body1.field_0 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)old) {
    sVar11 = sVar11 + 1;
    bglobal.body1.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)notOld;
  }
  if (bglobal.body2.field_0 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)old) {
    sVar11 = sVar11 + 1;
    bglobal.body2.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)notOld;
  }
  return sVar11;
}

Assistant:

size_t DObject::StaticPointerSubstitution (DObject *old, DObject *notOld, bool scandefaults)
{
	DObject *probe;
	size_t changed = 0;
	int i;

	// Go through all objects.
	i = 0;DObject *last=0;
	for (probe = GC::Root; probe != NULL; probe = probe->ObjNext)
	{
		i++;
		changed += probe->PointerSubstitution(old, notOld);
		last = probe;
	}

	if (scandefaults)
	{
		for (auto p : PClassActor::AllActorClasses)
		{
			auto def = GetDefaultByType(p);
			if (def != nullptr)
			{
				def->Class = p;
				def->DObject::PointerSubstitution(old, notOld);
				def->Class = nullptr;	// reset pointer. Defaults should not have a valid class pointer.
			}
		}
	}

	// Go through the bodyque.
	for (i = 0; i < BODYQUESIZE; ++i)
	{
		if (bodyque[i] == old)
		{
			bodyque[i] = static_cast<AActor *>(notOld);
			changed++;
		}
	}

	// Go through players.
	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
			changed += players[i].FixPointers (old, notOld);
	}

	for (auto &s : sectorPortals)
	{
		if (s.mSkybox == old)
		{
			s.mSkybox = static_cast<ASkyViewpoint*>(notOld);
			changed++;
		}
	}

	// Go through sectors.
	if (sectors != NULL)
	{
		for (i = 0; i < numsectors; ++i)
		{
#define SECTOR_CHECK(f,t) \
	if (sectors[i].f.p == static_cast<t *>(old)) { sectors[i].f = static_cast<t *>(notOld); changed++; }
			SECTOR_CHECK( SoundTarget, AActor );
			SECTOR_CHECK( SecActTarget, ASectorAction );
			SECTOR_CHECK( floordata, DSectorEffect );
			SECTOR_CHECK( ceilingdata, DSectorEffect );
			SECTOR_CHECK( lightingdata, DSectorEffect );
#undef SECTOR_CHECK
		}
	}

	// Go through bot stuff.
	if (bglobal.firstthing.p == (AActor *)old)		bglobal.firstthing = (AActor *)notOld, ++changed;
	if (bglobal.body1.p == (AActor *)old)			bglobal.body1 = (AActor *)notOld, ++changed;
	if (bglobal.body2.p == (AActor *)old)			bglobal.body2 = (AActor *)notOld, ++changed;

	return changed;
}